

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition-graph.hxx
# Opt level: O0

void __thiscall
lineage::heuristics::PartitionGraph::forceMove(PartitionGraph *this,size_t v,size_t partitionId)

{
  size_type sVar1;
  ostream *this_00;
  void *this_01;
  runtime_error *this_02;
  reference pvVar2;
  size_type in_RDX;
  ulong in_RSI;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *in_RDI;
  size_t previousPartition;
  key_type *in_stack_ffffffffffffff98;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *in_stack_ffffffffffffffa0;
  value_type *in_stack_ffffffffffffffa8;
  
  sVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     &in_RDI[2]._M_h._M_rehash_policy._M_next_resize);
  if (sVar1 <= in_RSI) {
    this_00 = std::operator<<((ostream *)&std::cerr,"Error log: Node v=");
    this_01 = (void *)std::ostream::operator<<(this_00,in_RSI);
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
    this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_02,"Failed to forceMove. Node doesnt exist!");
    __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                      &in_RDI[2]._M_h._M_rehash_policy._M_next_resize,in_RSI);
  std::
  vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
  ::operator[]((vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                *)&in_RDI[2]._M_h._M_before_begin,*pvVar2);
  std::
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  ::erase(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  std::
  vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
  ::operator[]((vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                *)&in_RDI[2]._M_h._M_before_begin,in_RDX);
  std::
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  ::insert(in_RDI,in_stack_ffffffffffffffa8);
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                      &in_RDI[2]._M_h._M_rehash_policy._M_next_resize,in_RSI);
  *pvVar2 = in_RDX;
  return;
}

Assistant:

void forceMove(const size_t v, const size_t partitionId)
    {
        if (v >= vertexLabels_.size()) {
            std::cerr << "Error log: Node v=" << v << std::endl;
            throw std::runtime_error("Failed to forceMove. Node doesnt exist!");
        }
        const size_t previousPartition = vertexLabels_[v];

        // move the node v to the same partition w.
        partitions_[previousPartition].erase(v);
        partitions_[partitionId].insert(v);
        vertexLabels_[v] = partitionId;
    }